

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

int Matvec_SparseCSC(SUNMatrix A,N_Vector x,N_Vector y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  realtype *prVar5;
  realtype *prVar6;
  realtype *yd;
  realtype *xd;
  realtype *Ax;
  sunindextype *Ai;
  sunindextype *Ap;
  sunindextype j;
  sunindextype i;
  N_Vector y_local;
  N_Vector x_local;
  SUNMatrix A_local;
  
  lVar1 = *(long *)((long)A->content + 0x38);
  lVar2 = *(long *)((long)A->content + 0x30);
  lVar3 = *(long *)((long)A->content + 0x20);
  if (((lVar1 == 0) || (lVar2 == 0)) || (lVar3 == 0)) {
    A_local._4_4_ = 1;
  }
  else {
    prVar5 = N_VGetArrayPointer(x);
    prVar6 = N_VGetArrayPointer(y);
    if (((prVar5 == (realtype *)0x0) || (prVar6 == (realtype *)0x0)) || (prVar5 == prVar6)) {
      A_local._4_4_ = 1;
    }
    else {
      for (j = 0; j < *A->content; j = j + 1) {
        prVar6[j] = 0.0;
      }
      for (Ap = (sunindextype *)0x0; (long)Ap < *(long *)((long)A->content + 8);
          Ap = (sunindextype *)((long)Ap + 1)) {
        for (j = *(sunindextype *)(lVar1 + (long)Ap * 8); j < *(long *)(lVar1 + 8 + (long)Ap * 8);
            j = j + 1) {
          lVar4 = *(long *)(lVar2 + j * 8);
          prVar6[lVar4] = *(double *)(lVar3 + j * 8) * prVar5[(long)Ap] + prVar6[lVar4];
        }
      }
      A_local._4_4_ = 0;
    }
  }
  return A_local._4_4_;
}

Assistant:

int Matvec_SparseCSC(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j;
  sunindextype *Ap, *Ai;
  realtype *Ax, *xd, *yd;

  /* access data from CSC structure (return if failure) */
  Ap = SM_INDEXPTRS_S(A);
  Ai = SM_INDEXVALS_S(A);
  Ax = SM_DATA_S(A);
  if ((Ap == NULL) || (Ai == NULL) || (Ax == NULL))
    return 1;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd) )
    return 1;

  /* initialize result */
  for (i=0; i<SM_ROWS_S(A); i++)
    yd[i] = 0.0;

  /* iterate through matrix columns */
  for (j=0; j<SM_COLUMNS_S(A); j++) {

    /* iterate down column of A, performing product */
    for (i=Ap[j]; i<Ap[j+1]; i++)
      yd[Ai[i]] += Ax[i]*xd[j];

  }

  return 0;
}